

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateNdMultiArrayInputType
                   (Result *__return_storage_ptr__,ArrayFeatureType *arrayType)

{
  ShapeFlexibilityCase SVar1;
  int iVar2;
  RepeatedField<long> *this;
  ArrayFeatureType_ShapeRange *this_00;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  ArrayFeatureType *pAStack_18;
  int rank;
  ArrayFeatureType *arrayType_local;
  
  pAStack_18 = arrayType;
  arrayType_local = (ArrayFeatureType *)__return_storage_ptr__;
  this = Specification::ArrayFeatureType::shape(arrayType);
  local_1c = google::protobuf::RepeatedField<long>::size(this);
  if (local_1c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Input MLMultiArray to neural networks must have at least 1 dimension.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    SVar1 = Specification::ArrayFeatureType::ShapeFlexibility_case(pAStack_18);
    if (((SVar1 != SHAPEFLEXIBILITY_NOT_SET) && (SVar1 != kEnumeratedShapes)) &&
       (SVar1 == kShapeRange)) {
      this_00 = Specification::ArrayFeatureType::shaperange(pAStack_18);
      iVar2 = Specification::ArrayFeatureType_ShapeRange::sizeranges_size(this_00);
      if (iVar2 != local_1c) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,
                   "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape."
                   ,&local_79);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        return __return_storage_ptr__;
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateNdMultiArrayInputType(const Specification::ArrayFeatureType& arrayType)
{
    auto rank = arrayType.shape().size();
    if (!(rank > 0)) {
        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have at least 1 dimension.");
    }
    switch (arrayType.ShapeFlexibility_case()) {
        case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
            break;
        case CoreML::Specification::ArrayFeatureType::kShapeRange:
            if (arrayType.shaperange().sizeranges_size() != rank) {
                return Result(ResultType::INVALID_MODEL_INTERFACE, "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape.");
                break;
            }
        case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
            break;
    }

    return Result();
}